

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

bool __thiscall S2Polyline::Intersects(S2Polyline *this,S2Polyline *line)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  S2Point *pSVar4;
  S2Point *b;
  S2Point *c;
  int local_f4;
  undefined1 local_f0 [4];
  int j;
  S2EdgeCrosser crosser;
  int i;
  S2LatLngRect local_70;
  S2LatLngRect local_48;
  S2Polyline *local_20;
  S2Polyline *line_local;
  S2Polyline *this_local;
  
  local_20 = line;
  line_local = this;
  iVar2 = num_vertices(this);
  if ((0 < iVar2) && (iVar2 = num_vertices(local_20), 0 < iVar2)) {
    GetRectBound(&local_48,this);
    GetRectBound(&local_70,local_20);
    bVar1 = S2LatLngRect::Intersects(&local_48,&local_70);
    S2LatLngRect::~S2LatLngRect(&local_70);
    S2LatLngRect::~S2LatLngRect(&local_48);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    crosser.acb_ = 1;
    do {
      iVar2 = crosser.acb_;
      iVar3 = num_vertices(this);
      if (iVar3 <= iVar2) {
        return false;
      }
      pSVar4 = vertex(this,crosser.acb_ + -1);
      b = vertex(this,crosser.acb_);
      c = vertex(local_20,0);
      S2EdgeCrosser::S2EdgeCrosser((S2EdgeCrosser *)local_f0,pSVar4,b,c);
      for (local_f4 = 1; iVar2 = num_vertices(local_20), local_f4 < iVar2; local_f4 = local_f4 + 1)
      {
        pSVar4 = vertex(local_20,local_f4);
        iVar2 = S2EdgeCrosser::CrossingSign((S2EdgeCrosser *)local_f0,pSVar4);
        if (-1 < iVar2) {
          return true;
        }
      }
      crosser.acb_ = crosser.acb_ + 1;
    } while( true );
  }
  return false;
}

Assistant:

bool S2Polyline::Intersects(const S2Polyline* line) const {
  if (num_vertices() <= 0 || line->num_vertices() <= 0) {
    return false;
  }

  if (!GetRectBound().Intersects(line->GetRectBound())) {
    return false;
  }

  // TODO(ericv): Use S2ShapeIndex here.
  for (int i = 1; i < num_vertices(); ++i) {
    S2EdgeCrosser crosser(
        &vertex(i - 1), &vertex(i), &line->vertex(0));
    for (int j = 1; j < line->num_vertices(); ++j) {
      if (crosser.CrossingSign(&line->vertex(j)) >= 0) {
        return true;
      }
    }
  }
  return false;
}